

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_textedit.h
# Opt level: O0

ImWchar * ImStb::stb_text_createundo(StbUndoState *state,int pos,int insert_len,int delete_len)

{
  StbUndoRecord *pSVar1;
  StbUndoRecord *r;
  int delete_len_local;
  int insert_len_local;
  int pos_local;
  StbUndoState *state_local;
  
  pSVar1 = stb_text_create_undo_record(state,insert_len);
  if (pSVar1 == (StbUndoRecord *)0x0) {
    state_local = (StbUndoState *)0x0;
  }
  else {
    pSVar1->where = pos;
    pSVar1->insert_length = insert_len;
    pSVar1->delete_length = delete_len;
    if (insert_len == 0) {
      pSVar1->char_storage = -1;
      state_local = (StbUndoState *)0x0;
    }
    else {
      pSVar1->char_storage = state->undo_char_point;
      state->undo_char_point = insert_len + state->undo_char_point;
      state_local = (StbUndoState *)(state->undo_char + pSVar1->char_storage);
    }
  }
  return (ImWchar *)state_local;
}

Assistant:

static STB_TEXTEDIT_CHARTYPE *stb_text_createundo(StbUndoState *state, int pos, int insert_len, int delete_len)
{
   StbUndoRecord *r = stb_text_create_undo_record(state, insert_len);
   if (r == NULL)
      return NULL;

   r->where = pos;
   r->insert_length = (STB_TEXTEDIT_POSITIONTYPE) insert_len;
   r->delete_length = (STB_TEXTEDIT_POSITIONTYPE) delete_len;

   if (insert_len == 0) {
      r->char_storage = -1;
      return NULL;
   } else {
      r->char_storage = state->undo_char_point;
      state->undo_char_point += insert_len;
      return &state->undo_char[r->char_storage];
   }
}